

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O3

void __thiscall
stateObservation::ZeroDelayObserver::setCurrentState(ZeroDelayObserver *this,StateVector *x_k)

{
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong size_00;
  double *pdVar4;
  double dVar5;
  int iVar6;
  Index index;
  ulong uVar7;
  long lVar8;
  Index size;
  
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      == false) {
    __assert_fail("x_.isSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x22,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  iVar6 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])();
  if ((char)iVar6 == '\0') {
    __assert_fail("checkStateVector(x_k) && \"The size of the state vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x23,
                  "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
                 );
  }
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      == false) {
    __assert_fail("isSet() && \"Error: Matrix not initialized, if you are initializing it,                             use set() function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0xd6,
                  "bool stateObservation::IndexedMatrixT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, lazy = false]"
                 );
  }
  this_00 = &(this->x_).v_;
  pdVar3 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  size_00 = (x_k->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != size_00) {
    if ((long)size_00 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,size_00,size_00,1);
    if ((this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != size_00) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  uVar7 = size_00 - ((long)size_00 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)size_00) {
    lVar8 = 0;
    do {
      pdVar1 = pdVar3 + lVar8;
      dVar5 = pdVar1[1];
      pdVar2 = pdVar4 + lVar8;
      *pdVar2 = *pdVar1;
      pdVar2[1] = dVar5;
      lVar8 = lVar8 + 2;
    } while (lVar8 < (long)uVar7);
  }
  if ((long)uVar7 < (long)size_00) {
    do {
      pdVar4[uVar7] = pdVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (size_00 != uVar7);
  }
  return;
}

Assistant:

void ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector & x_k)
{
  BOOST_ASSERT(x_.isSet() && "The state vector has not been set");
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_() = x_k;
}